

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3Writelock(Fts3Table *p)

{
  sqlite3_stmt *local_20;
  sqlite3_stmt *pStmt;
  Fts3Table *pFStack_10;
  int rc;
  Fts3Table *p_local;
  
  pStmt._4_4_ = 0;
  if ((p->nPendingData == 0) &&
     (pFStack_10 = p, pStmt._4_4_ = fts3SqlStmt(p,0x10,&local_20,(sqlite3_value **)0x0),
     pStmt._4_4_ == 0)) {
    sqlite3_bind_null(local_20,1);
    sqlite3_step(local_20);
    pStmt._4_4_ = sqlite3_reset(local_20);
  }
  return pStmt._4_4_;
}

Assistant:

static int fts3Writelock(Fts3Table *p){
  int rc = SQLITE_OK;
  
  if( p->nPendingData==0 ){
    sqlite3_stmt *pStmt;
    rc = fts3SqlStmt(p, SQL_DELETE_SEGDIR_LEVEL, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_null(pStmt, 1);
      sqlite3_step(pStmt);
      rc = sqlite3_reset(pStmt);
    }
  }

  return rc;
}